

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O3

void SSL_get0_ocsp_response(SSL *ssl,uint8_t **out,size_t *out_len)

{
  SSL_SESSION *pSVar1;
  uint8_t *puVar2;
  size_t sVar3;
  
  pSVar1 = SSL_get_session((SSL *)ssl);
  if ((pSVar1 == (SSL_SESSION *)0x0 || (ssl->field_0xa4 & 1) != 0) ||
     (*(CRYPTO_BUFFER **)(pSVar1->krb5_client_princ + 0x80) == (CRYPTO_BUFFER *)0x0)) {
    *out_len = 0;
    *out = (uint8_t *)0x0;
  }
  else {
    puVar2 = CRYPTO_BUFFER_data(*(CRYPTO_BUFFER **)(pSVar1->krb5_client_princ + 0x80));
    *out = puVar2;
    sVar3 = CRYPTO_BUFFER_len(*(CRYPTO_BUFFER **)(pSVar1->krb5_client_princ + 0x80));
    *out_len = sVar3;
  }
  return;
}

Assistant:

void SSL_get0_ocsp_response(const SSL *ssl, const uint8_t **out,
                            size_t *out_len) {
  SSL_SESSION *session = SSL_get_session(ssl);
  if (ssl->server || !session || !session->ocsp_response) {
    *out_len = 0;
    *out = NULL;
    return;
  }

  *out = CRYPTO_BUFFER_data(session->ocsp_response.get());
  *out_len = CRYPTO_BUFFER_len(session->ocsp_response.get());
}